

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int zip_has_symlink_attr(ZIPentry *entry,PHYSFS_uint32 extern_attr)

{
  int iVar1;
  bool local_17;
  PHYSFS_uint16 xattr;
  PHYSFS_uint32 extern_attr_local;
  ZIPentry *entry_local;
  
  iVar1 = zip_version_does_symlinks((uint)entry->version);
  local_17 = false;
  if ((iVar1 != 0) && (local_17 = false, entry->uncompressed_size != 0)) {
    local_17 = ((ushort)(extern_attr >> 0x10) & 0xf000) == 0xa000;
  }
  return (int)local_17;
}

Assistant:

static inline int zip_has_symlink_attr(const ZIPentry *entry,
                                       const PHYSFS_uint32 extern_attr)
{
    PHYSFS_uint16 xattr = ((extern_attr >> 16) & 0xFFFF);
    return ( (zip_version_does_symlinks(entry->version)) &&
             (entry->uncompressed_size > 0) &&
             ((xattr & UNIX_FILETYPE_MASK) == UNIX_FILETYPE_SYMLINK) );
}